

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void RangeEnc_Encode(CPpmd7z_RangeEnc *p,UInt32 start,UInt32 size,UInt32 total)

{
  ulong uVar1;
  UInt32 total_local;
  UInt32 size_local;
  UInt32 start_local;
  CPpmd7z_RangeEnc *p_local;
  
  uVar1 = (ulong)p->Range / (ulong)total;
  p->Range = (UInt32)uVar1;
  p->Low = start * uVar1 + p->Low;
  p->Range = size * p->Range;
  while (p->Range < 0x1000000) {
    p->Range = p->Range << 8;
    RangeEnc_ShiftLow(p);
  }
  return;
}

Assistant:

static void RangeEnc_Encode(CPpmd7z_RangeEnc *p, UInt32 start, UInt32 size, UInt32 total)
{
  p->Low += (UInt64)start * (UInt64)(p->Range /= total);
  p->Range *= size;
  while (p->Range < kTopValue)
  {
    p->Range <<= 8;
    RangeEnc_ShiftLow(p);
  }
}